

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O3

int ixmlElement_setAttributeNodeNS(IXML_Element *element,IXML_Attr *newAttr,IXML_Attr **rtAttr)

{
  IXML_Attr *pIVar1;
  char *__s2;
  Nodeptr p_Var2;
  Nodeptr p_Var3;
  int iVar4;
  IXML_Attr *pIVar5;
  
  if (newAttr == (IXML_Attr *)0x0 || element == (IXML_Element *)0x0) {
    return 0x69;
  }
  if ((newAttr->n).ownerDocument != (element->n).ownerDocument) {
    return 4;
  }
  if (newAttr->ownerElement != (IXML_Element *)0x0 && newAttr->ownerElement != element) {
    return 10;
  }
  newAttr->ownerElement = element;
  pIVar1 = (IXML_Attr *)(element->n).firstAttr;
  if (pIVar1 != (IXML_Attr *)0x0) {
    __s2 = (newAttr->n).localName;
    pIVar5 = pIVar1;
    do {
      iVar4 = strcmp((pIVar5->n).localName,__s2);
      if ((iVar4 == 0) &&
         (iVar4 = strcmp((pIVar5->n).namespaceURI,(newAttr->n).namespaceURI), iVar4 == 0)) {
        p_Var2 = (pIVar5->n).prevSibling;
        p_Var3 = (pIVar5->n).nextSibling;
        if (p_Var2 != (Nodeptr)0x0) {
          p_Var2->nextSibling = &newAttr->n;
        }
        if (p_Var3 != (Nodeptr)0x0) {
          p_Var3->prevSibling = &newAttr->n;
        }
        if (pIVar1 == pIVar5) {
          (element->n).firstAttr = &newAttr->n;
        }
        goto LAB_00124e36;
      }
      pIVar5 = (IXML_Attr *)(pIVar5->n).nextSibling;
    } while (pIVar5 != (IXML_Attr *)0x0);
    if (pIVar1 != (IXML_Attr *)0x0) {
      do {
        pIVar5 = pIVar1;
        pIVar1 = (IXML_Attr *)(pIVar5->n).nextSibling;
      } while (pIVar1 != (IXML_Attr *)0x0);
      (pIVar5->n).nextSibling = &newAttr->n;
      goto LAB_00124e2e;
    }
  }
  (element->n).firstAttr = &newAttr->n;
  (newAttr->n).prevSibling = (Nodeptr)0x0;
  (newAttr->n).nextSibling = (Nodeptr)0x0;
LAB_00124e2e:
  pIVar5 = (IXML_Attr *)0x0;
  if (rtAttr != (IXML_Attr **)0x0) {
LAB_00124e36:
    *rtAttr = pIVar5;
  }
  return 0;
}

Assistant:

int ixmlElement_setAttributeNodeNS(
	/* IN */ IXML_Element *element,
	/* IN */ IXML_Attr *newAttr,
	/* OUT */ IXML_Attr **rtAttr)
{
	IXML_Node *attrNode = NULL;
	IXML_Node *node = NULL;
	IXML_Node *prevAttr = NULL;
	IXML_Node *nextAttr = NULL;
	IXML_Node *preSib = NULL;
	IXML_Node *nextSib = NULL;

	if (element == NULL || newAttr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (newAttr->n.ownerDocument != element->n.ownerDocument) {
		return IXML_WRONG_DOCUMENT_ERR;
	}

	if (newAttr->ownerElement != NULL && newAttr->ownerElement != element) {
		return IXML_INUSE_ATTRIBUTE_ERR;
	}

	newAttr->ownerElement = element;
	node = (IXML_Node *)newAttr;
	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->localName, node->localName) == 0 &&
			strcmp(attrNode->namespaceURI, node->namespaceURI) ==
				0) {
			/* Found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}
	if (attrNode != NULL) {
		/* already present, will replace by newAttr */
		preSib = attrNode->prevSibling;
		nextSib = attrNode->nextSibling;
		if (preSib != NULL) {
			preSib->nextSibling = node;
		}
		if (nextSib != NULL) {
			nextSib->prevSibling = node;
		}
		if (element->n.firstAttr == attrNode) {
			element->n.firstAttr = node;
		}
		*rtAttr = (IXML_Attr *)attrNode;

	} else {
		/* Add this attribute  */
		if (element->n.firstAttr != NULL) {
			/* Element has attribute already */
			prevAttr = element->n.firstAttr;
			nextAttr = prevAttr->nextSibling;
			while (nextAttr != NULL) {
				prevAttr = nextAttr;
				nextAttr = prevAttr->nextSibling;
			}
			prevAttr->nextSibling = node;
		} else {
			/* This is the first attribute node */
			element->n.firstAttr = node;
			node->prevSibling = NULL;
			node->nextSibling = NULL;
		}
		if (rtAttr != NULL) {
			*rtAttr = NULL;
		}
	}

	return IXML_SUCCESS;
}